

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<double,unsigned_long>
               (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined4 uVar5;
  undefined4 uVar6;
  double *in_stack_00000008;
  double *in_stack_00000010;
  unsigned_long ix_1;
  unsigned_long ix;
  byte local_51;
  double local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  *in_stack_00000008 = INFINITY;
  *in_stack_00000010 = -INFINITY;
  if ((ulong)(*(long *)(in_R8 + 8 + in_RDI * 8) - *(long *)(in_R8 + in_RDI * 8)) < in_RSI) {
    *in_stack_00000008 = 0.0;
    *in_stack_00000010 = 0.0;
  }
  if (in_R9D == 0) {
    for (local_38 = *(ulong *)(in_R8 + in_RDI * 8); local_38 < *(ulong *)(in_R8 + 8 + in_RDI * 8);
        local_38 = local_38 + 1) {
      if (*in_stack_00000008 <= *(double *)(in_RDX + local_38 * 8)) {
        local_48 = *in_stack_00000008;
      }
      else {
        local_48 = *(double *)(in_RDX + local_38 * 8);
      }
      *in_stack_00000008 = local_48;
      dVar1 = *(double *)(in_RDX + local_38 * 8);
      if (dVar1 < *in_stack_00000010 || dVar1 == *in_stack_00000010) {
        local_50 = *in_stack_00000010;
      }
      else {
        local_50 = *(double *)(in_RDX + local_38 * 8);
      }
      *in_stack_00000010 = local_50;
    }
  }
  else {
    for (local_40 = *(ulong *)(in_R8 + in_RDI * 8); local_40 < *(ulong *)(in_R8 + 8 + in_RDI * 8);
        local_40 = local_40 + 1) {
      uVar3 = std::isinf(*(double *)(in_RDX + local_40 * 8));
      if ((uVar3 & 1) == 0) {
        dVar1 = *in_stack_00000008;
        dVar2 = *(double *)(in_RDX + local_40 * 8);
        uVar5 = SUB84(dVar2,0);
        uVar6 = (int)((ulong)dVar2 >> 0x20);
        if (dVar1 <= dVar2) {
          uVar5 = SUB84(dVar1,0);
          uVar6 = (int)((ulong)dVar1 >> 0x20);
        }
        *in_stack_00000008 =
             (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar6,uVar5) |
                     -(ulong)NAN(dVar1) & (ulong)dVar2);
        dVar1 = *in_stack_00000010;
        dVar2 = *(double *)(in_RDX + local_40 * 8);
        uVar5 = SUB84(dVar2,0);
        uVar6 = (int)((ulong)dVar2 >> 0x20);
        if (dVar2 <= dVar1) {
          uVar5 = SUB84(dVar1,0);
          uVar6 = (int)((ulong)dVar1 >> 0x20);
        }
        *in_stack_00000010 =
             (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar6,uVar5) |
                     -(ulong)NAN(dVar1) & (ulong)dVar2);
      }
    }
  }
  local_51 = 1;
  if ((*in_stack_00000008 != *in_stack_00000010) ||
     (NAN(*in_stack_00000008) || NAN(*in_stack_00000010))) {
    if ((*in_stack_00000008 == INFINITY) && (!NAN(*in_stack_00000008))) {
      local_51 = 1;
      if ((*in_stack_00000010 == -INFINITY) && (!NAN(*in_stack_00000010))) goto LAB_003b51f2;
    }
    uVar3 = std::isnan(*in_stack_00000008);
    local_51 = 1;
    if ((uVar3 & 1) == 0) {
      iVar4 = std::isnan(*in_stack_00000010);
      local_51 = (byte)iVar4;
    }
  }
LAB_003b51f2:
  *(byte *)ix_1 = local_51 & 1;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}